

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodea_io.c
# Opt level: O3

int CVodeSetAdjNoSensi(void *cvode_mem)

{
  int line;
  int iVar1;
  int error_code;
  char *msgfmt;
  
  if (cvode_mem == (void *)0x0) {
    msgfmt = "cvode_mem = NULL illegal.";
    iVar1 = -0x15;
    cvode_mem = (CVodeMem)0x0;
    error_code = -0x15;
    line = 0x3f;
  }
  else {
    if (*(int *)((long)cvode_mem + 0xa78) != 0) {
      *(undefined4 *)(*(long *)((long)cvode_mem + 0xa70) + 0xb8) = 0;
      return 0;
    }
    msgfmt = "Illegal attempt to call before calling CVodeAdjMalloc.";
    iVar1 = -0x65;
    error_code = -0x65;
    line = 0x47;
  }
  cvProcessError((CVodeMem)cvode_mem,error_code,line,"CVodeSetAdjNoSensi",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodea_io.c"
                 ,msgfmt);
  return iVar1;
}

Assistant:

int CVodeSetAdjNoSensi(void* cvode_mem)
{
  CVodeMem cv_mem;
  CVadjMem ca_mem;

  /* Check if cvode_mem exists */
  if (cvode_mem == NULL)
  {
    cvProcessError(NULL, CV_MEM_NULL, __LINE__, __func__, __FILE__, MSGCV_NO_MEM);
    return (CV_MEM_NULL);
  }
  cv_mem = (CVodeMem)cvode_mem;

  /* Was ASA initialized? */
  if (cv_mem->cv_adjMallocDone == SUNFALSE)
  {
    cvProcessError(cv_mem, CV_NO_ADJ, __LINE__, __func__, __FILE__, MSGCV_NO_ADJ);
    return (CV_NO_ADJ);
  }
  ca_mem = cv_mem->cv_adj_mem;

  ca_mem->ca_IMstoreSensi = SUNFALSE;

  return (CV_SUCCESS);
}